

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t n;
  long lVar1;
  size_t n_1;
  int R [5];
  int T [10];
  uint local_58 [8];
  uint local_38 [10];
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[8] = 0;
  local_38[9] = 0;
  lVar1 = 0;
  do {
    local_58[lVar1] = 10;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    printf("%d ",(ulong)local_38[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  putchar(10);
  lVar1 = 0;
  do {
    printf("%d ",(ulong)local_58[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int T[10];
  int R[5];

  for (size_t n = 0; n < 10; n++) {
    T[n] = 0;
  }
  for (size_t n = 0; n < 5; n++) {
    R[n] = 10;
  }

  for (size_t n = 0; n < 10; n++) {
    printf("%d ", T[n]);
  }
  printf("\n");
  for (size_t n = 0; n < 5; n++) {
    printf("%d ", R[n]);
  }
  printf("\n");
}